

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::JsonReporter::sectionStarting(JsonReporter *this,SectionInfo *sectionInfo)

{
  JsonObjectWriter *pJVar1;
  JsonValueWriter *in_RDI;
  StringRef SVar2;
  SourceLineInfo *in_stack_00000168;
  JsonObjectWriter *in_stack_00000170;
  JsonObjectWriter *sectionObject;
  size_t in_stack_fffffffffffffc38;
  char *in_stack_fffffffffffffc40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  JsonReporter *local_398;
  char *local_388;
  size_t local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378 [12];
  JsonReporter *in_stack_fffffffffffffe20;
  char *in_stack_fffffffffffffe28;
  char *pcVar3;
  void *local_1c8;
  char *local_1c0;
  size_t local_1b8;
  JsonValueWriter local_1b0;
  JsonObjectWriter *local_18;
  
  pJVar1 = startObject(local_398);
  local_18 = pJVar1;
  SVar2 = operator____sr(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
  local_1c0 = SVar2.m_start;
  local_1b8 = SVar2.m_size;
  JsonObjectWriter::write((JsonObjectWriter *)&local_1b0,(int)pJVar1,local_1c0,local_1b8);
  SVar2 = operator____sr(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
  pcVar3 = SVar2.m_start;
  local_1c8 = (void *)SVar2.m_size;
  JsonValueWriter::write(&local_1b0,(int)SVar2.m_start,local_1c8,local_1b8);
  JsonValueWriter::~JsonValueWriter((JsonValueWriter *)0x1a4e40);
  pJVar1 = local_18;
  SVar2 = operator____sr((char *)local_18,in_stack_fffffffffffffc38);
  local_388 = SVar2.m_start;
  local_380 = SVar2.m_size;
  value = local_378;
  JsonObjectWriter::write((JsonObjectWriter *)value,(int)pJVar1,local_388,local_380);
  JsonValueWriter::write<std::__cxx11::string>(in_RDI,value);
  JsonValueWriter::~JsonValueWriter((JsonValueWriter *)0x1a4ea4);
  std::
  stack<Catch::JsonObjectWriter,_std::deque<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>_>
  ::top((stack<Catch::JsonObjectWriter,_std::deque<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>_>
         *)0x1a4eb5);
  anon_unknown_26::writeSourceInfo(in_stack_00000170,in_stack_00000168);
  operator____sr((char *)pJVar1,in_stack_fffffffffffffc38);
  SVar2.m_size = (size_type)pcVar3;
  SVar2.m_start = in_stack_fffffffffffffe28;
  startArray(in_stack_fffffffffffffe20,SVar2);
  return;
}

Assistant:

void JsonReporter::sectionStarting( SectionInfo const& sectionInfo ) {
        assert( isInside( Writer::Array ) &&
                "Section should always start inside an object" );
        // We want to nest top level sections, even though it shares name
        // and source loc with the TEST_CASE
        auto& sectionObject = startObject();
        sectionObject.write( "kind"_sr ).write( "section"_sr );
        sectionObject.write( "name"_sr ).write( sectionInfo.name );
        writeSourceInfo( m_objectWriters.top(), sectionInfo.lineInfo );


        // TBD: Do we want to create this event lazily? It would become
        //      rather complex, but we could do it, and it would look
        //      better for empty sections. OTOH, empty sections should
        //      be rare.
        startArray( "path"_sr );
    }